

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  uint uVar2;
  Edition *pEVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  iVar1 = this->m_editions_size;
  uVar2 = this->m_editions_count;
  if ((int)uVar2 < iVar1) {
    return true;
  }
  iVar6 = 1;
  if (iVar1 != 0) {
    iVar6 = iVar1 * 2;
  }
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar7 = (long)iVar6 << 4 | 8;
  }
  plVar4 = (long *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
  if (plVar4 == (long *)0x0) {
    return false;
  }
  *plVar4 = (long)iVar6;
  pEVar3 = this->m_editions;
  if ((int)uVar2 < 1) {
    if (pEVar3 == (Edition *)0x0) goto LAB_001103ca;
  }
  else {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)plVar4 + lVar5 + 8) = *(undefined8 *)((long)&pEVar3->m_atoms + lVar5);
      *(undefined8 *)((long)plVar4 + lVar5 + 0x10) =
           *(undefined8 *)((long)&pEVar3->m_atoms_size + lVar5);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar5);
  }
  operator_delete__(&pEVar3[-1].m_atoms_size);
LAB_001103ca:
  this->m_editions = (Edition *)(plVar4 + 1);
  this->m_editions_size = iVar6;
  return true;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}